

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O3

type cm::operator==(basic_string_view<char,_std::char_traits<char>_> *l,String *r)

{
  size_t __n;
  char *__s1;
  type tVar1;
  int iVar2;
  size_type __rlen;
  string_view sVar3;
  
  __n = l->_M_len;
  __s1 = l->_M_str;
  sVar3 = AsStringView<cm::String>::view(r);
  if (__n == sVar3._M_len) {
    if (__n != 0) {
      iVar2 = bcmp(__s1,sVar3._M_str,__n);
      if (iVar2 != 0) goto LAB_0014b82f;
    }
    tVar1 = true;
  }
  else {
LAB_0014b82f:
    tVar1 = false;
  }
  return tVar1;
}

Assistant:

static string_view view(string_view const& s) { return s; }